

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

void __thiscall
helics::MessageFederate::registerMessageInterfacesJsonDetail
          (MessageFederate *this,JsonBuffer *jsonBuff,bool defaultGlobal)

{
  string_view sinkName;
  string_view defVal;
  string_view eptName_00;
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *piVar4;
  const_reference jref;
  byte in_DL;
  MessageFederate *in_RSI;
  Endpoint *epObj_1;
  string eptName_1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *ept_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  value_type *__range2_1;
  Endpoint *epObj;
  bool targeted;
  bool global;
  string type;
  string eptName;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *ept;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  json *iface;
  bool defaultTargeted;
  json *json;
  Endpoint *in_stack_00000330;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_00000338;
  MessageFederate *in_stack_00000340;
  uint in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  MessageFederate *in_stack_fffffffffffffd00;
  json *in_stack_fffffffffffffd08;
  json *element;
  Endpoint *in_stack_fffffffffffffd10;
  Endpoint *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  byte in_stack_fffffffffffffd27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  allocator<char> *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  byte in_stack_fffffffffffffd3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  allocator<char> *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *local_2a0;
  allocator<char> *paVar5;
  JsonBuffer in_stack_fffffffffffffd98;
  string_view in_stack_fffffffffffffda0;
  size_t in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  allocator<char> local_1a9 [39];
  byte local_182;
  allocator<char> local_181 [40];
  byte local_159;
  undefined8 local_158;
  undefined8 uStack_150;
  allocator<char> local_139 [97];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  const_reference local_90;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *local_88;
  allocator<char> local_79 [36];
  undefined1 local_55;
  allocator<char> local_41 [40];
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar2 = in_DL & 1;
  piVar4 = (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            *)fileops::JsonBuffer::json_abi_cxx11_((JsonBuffer *)in_RSI);
  paVar5 = local_41;
  unique0x10000963 = piVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd40,
             (char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
             in_stack_fffffffffffffd30);
  fileops::replaceIfMember
            ((json *)in_stack_fffffffffffffd00,
             (string *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
             (bool *)0x2ab727);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd00);
  std::allocator<char>::~allocator(local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd40,
             (char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
             in_stack_fffffffffffffd30);
  bVar3 = fileops::getOrDefault
                    ((json *)in_stack_fffffffffffffd00,
                     (string *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),false);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd00);
  std::allocator<char>::~allocator(local_79);
  local_55 = bVar3;
  bVar3 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[11],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                     (char (*) [11])in_stack_fffffffffffffd18);
  if (bVar3) {
    local_2a0 = (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
  }
  else {
    local_2a0 = stack0xffffffffffffffe0;
  }
  local_88 = local_2a0;
  bVar3 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[10],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                     (char (*) [10])in_stack_fffffffffffffd18);
  if (bVar3) {
    local_90 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    while (bVar3 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffffd00,
                              (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)),
          bVar3) {
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 nlohmann::json_abi_v3_11_3::detail::
                 iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 ::operator*(piVar4);
      fileops::getName(in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd50 = local_d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,
                 (char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30);
      local_158 = 0;
      uStack_150 = 0;
      defVal._M_str._0_7_ = in_stack_fffffffffffffd38;
      defVal._M_len = (size_t)in_stack_fffffffffffffd30;
      defVal._M_str._7_1_ = in_stack_fffffffffffffd3f;
      fileops::getOrDefault
                ((json *)in_stack_fffffffffffffd28,
                 (string *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),defVal);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd00);
      std::allocator<char>::~allocator(local_139);
      in_stack_fffffffffffffd48 = local_181;
      in_stack_fffffffffffffd40 = local_d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,
                 (char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30);
      in_stack_fffffffffffffd3f =
           fileops::getOrDefault
                     ((json *)in_stack_fffffffffffffd00,
                      (string *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),false)
      ;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd00);
      std::allocator<char>::~allocator(local_181);
      local_159 = in_stack_fffffffffffffd3f & 1;
      in_stack_fffffffffffffd30 = local_1a9;
      in_stack_fffffffffffffd28 = local_d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,
                 (char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30);
      in_stack_fffffffffffffd27 =
           fileops::getOrDefault
                     ((json *)in_stack_fffffffffffffd00,
                      (string *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),false)
      ;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd00);
      std::allocator<char>::~allocator((allocator<char> *)local_1a9);
      local_182 = in_stack_fffffffffffffd27 & 1;
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd00);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd00);
      in_stack_fffffffffffffcf8 = local_182 & 1;
      eptName_00._M_str = in_stack_fffffffffffffdb8;
      eptName_00._M_len = in_stack_fffffffffffffdb0;
      in_stack_fffffffffffffd18 =
           registerEndpoint((MessageFederate *)in_stack_fffffffffffffd98.reference,eptName_00,
                            in_stack_fffffffffffffda0,SUB81((ulong)paVar5 >> 0x38,0),
                            SUB81((ulong)paVar5 >> 0x30,0));
      loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                (in_stack_00000340,in_stack_00000338,in_stack_00000330);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd00);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd00);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    *)in_stack_fffffffffffffd00);
    }
  }
  bVar3 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[10],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                     (char (*) [10])in_stack_fffffffffffffd18);
  if (bVar3) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    while (bVar3 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffffd00,
                              (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)),
          bVar3) {
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator*(piVar4);
      element = (json *)&stack0xfffffffffffffdb8;
      fileops::getName(element);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd00);
      sinkName._M_str = (char *)in_stack_fffffffffffffd10;
      sinkName._M_len = (size_t)element;
      in_stack_fffffffffffffd10 = registerDataSink(in_stack_fffffffffffffd00,sinkName);
      loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                (in_stack_00000340,in_stack_00000338,in_stack_00000330);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd00);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    *)in_stack_fffffffffffffd00);
    }
  }
  bVar3 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[7],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                     (char (*) [7])in_stack_fffffffffffffd18);
  if (bVar3) {
    jref = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
    fileops::JsonBuffer::JsonBuffer((JsonBuffer *)&stack0xfffffffffffffd98,jref);
    piVar4 = stack0xffffffffffffffe0;
    uVar1 = (ulong)stack0xffffffffffffffe0 >> 0x38;
    bVar3 = SUB81(uVar1,0);
    unique0x1000096b = piVar4;
    registerMessageInterfacesJsonDetail
              (in_RSI,(JsonBuffer *)CONCAT17(bVar2,in_stack_ffffffffffffffe8),bVar3);
  }
  return;
}

Assistant:

void MessageFederate::registerMessageInterfacesJsonDetail(const fileops::JsonBuffer& jsonBuff,
                                                          bool defaultGlobal)
{
    const auto& json = jsonBuff.json();
    fileops::replaceIfMember(json, "defaultglobal", defaultGlobal);
    const bool defaultTargeted = fileops::getOrDefault(json, "targeted", false);

    const nlohmann::json& iface = (json.contains("interfaces")) ? json["interfaces"] : json;

    if (iface.contains("endpoints")) {
        for (const auto& ept : iface["endpoints"]) {
            auto eptName = fileops::getName(ept);
            auto type = fileops::getOrDefault(ept, "type", emptyStr);
            const bool global = fileops::getOrDefault(ept, "global", defaultGlobal);
            const bool targeted = fileops::getOrDefault(ept, "targeted", defaultTargeted);
            Endpoint& epObj = registerEndpoint(eptName, type, global, targeted);

            loadOptions(this, ept, epObj);
        }
    }
    if (iface.contains("datasinks")) {
        for (const auto& ept : iface["datasinks"]) {
            auto eptName = fileops::getName(ept);
            Endpoint& epObj = registerDataSink(eptName);

            loadOptions(this, ept, epObj);
        }
    }
    if (json.contains("helics")) {
        registerMessageInterfacesJsonDetail(json["helics"], defaultGlobal);
    }
}